

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O0

ptrdiff_t CLI::detail::find_member
                    (string *name,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *names,bool ignore_case,bool ignore_underscore)

{
  bool bVar1;
  difference_type local_1d0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_190;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_180;
  string *local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_170;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_160;
  string local_158;
  string local_138;
  string *local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  string local_f8;
  string local_d8;
  string *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  string local_88;
  string local_68;
  string local_48;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  const_iterator it;
  bool ignore_underscore_local;
  bool ignore_case_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *names_local;
  string *name_local;
  
  it._M_current._6_1_ = ignore_underscore;
  it._M_current._7_1_ = ignore_case;
  local_28._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ::std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(names);
  if ((it._M_current._7_1_ & 1) == 0) {
    if ((it._M_current._6_1_ & 1) == 0) {
      local_188._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ::std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                     (names);
      local_190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ::std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                            (names);
      local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ::std::
                  find<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                            (local_188,
                             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )local_190,name);
      local_28 = (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_180;
    }
    else {
      ::std::__cxx11::string::string((string *)&local_158,name);
      remove_underscore(&local_138,&local_158);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (name,&local_138);
      ::std::__cxx11::string::~string((string *)&local_138);
      ::std::__cxx11::string::~string((string *)&local_158);
      local_168._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ::std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                     (names);
      local_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ::std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                            (names);
      local_178 = name;
      local_160 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ::std::
                  find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,CLI::detail::find_member(std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,bool,bool)::_lambda(std::__cxx11::string)_3_>
                            (local_168,
                             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )local_170,(anon_class_8_1_898f2789_for__M_pred)name);
      local_28 = (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_160;
    }
  }
  else if ((it._M_current._6_1_ & 1) == 0) {
    ::std::__cxx11::string::string((string *)&local_f8,name);
    to_lower(&local_d8,&local_f8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (name,&local_d8);
    ::std::__cxx11::string::~string((string *)&local_d8);
    ::std::__cxx11::string::~string((string *)&local_f8);
    local_108._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ::std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(names)
    ;
    local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ::std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          (names);
    local_118 = name;
    local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ::std::
                find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,CLI::detail::find_member(std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,bool,bool)::_lambda(std::__cxx11::string)_2_>
                          (local_108,
                           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )local_110,(anon_class_8_1_898f2789_for__M_pred)name);
    local_28 = (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )local_100;
  }
  else {
    ::std::__cxx11::string::string((string *)&local_88,name);
    remove_underscore(&local_68,&local_88);
    to_lower(&local_48,&local_68);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (name,&local_48);
    ::std::__cxx11::string::~string((string *)&local_48);
    ::std::__cxx11::string::~string((string *)&local_68);
    ::std::__cxx11::string::~string((string *)&local_88);
    local_a8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ::std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(names)
    ;
    local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ::std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                         (names);
    local_b8 = name;
    local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ::std::
               find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,CLI::detail::find_member(std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,bool,bool)::_lambda(std::__cxx11::string)_1_>
                         (local_a8,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    )local_b0,(anon_class_8_1_898f2789_for__M_pred)name);
    local_28 = (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )local_a0;
  }
  local_198._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ::std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(names);
  bVar1 = __gnu_cxx::
          operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    (&local_28,&local_198);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_1d0 = -1;
  }
  else {
    local_1a0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ::std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(names)
    ;
    local_1d0 = __gnu_cxx::operator-(&local_28,&local_1a0);
  }
  return local_1d0;
}

Assistant:

inline std::ptrdiff_t find_member(std::string name,
                                  const std::vector<std::string> names,
                                  bool ignore_case = false,
                                  bool ignore_underscore = false) {
    auto it = std::end(names);
    if(ignore_case) {
        if(ignore_underscore) {
            name = detail::to_lower(detail::remove_underscore(name));
            it = std::find_if(std::begin(names), std::end(names), [&name](std::string local_name) {
                return detail::to_lower(detail::remove_underscore(local_name)) == name;
            });
        } else {
            name = detail::to_lower(name);
            it = std::find_if(std::begin(names), std::end(names), [&name](std::string local_name) {
                return detail::to_lower(local_name) == name;
            });
        }

    } else if(ignore_underscore) {
        name = detail::remove_underscore(name);
        it = std::find_if(std::begin(names), std::end(names), [&name](std::string local_name) {
            return detail::remove_underscore(local_name) == name;
        });
    } else {
        it = std::find(std::begin(names), std::end(names), name);
    }

    return (it != std::end(names)) ? (it - std::begin(names)) : (-1);
}